

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InternalStringNoCaseComparer.cpp
# Opt level: O3

int JsUtil::NoCaseComparer<JsUtil::CharacterBuffer<char16_t>_>::Compare
              (CharacterBuffer<char16_t> *s1,CharacterBuffer<char16_t> *s2)

{
  char16_t cVar1;
  char16_t cVar2;
  uint uVar3;
  char16_t *pcVar4;
  char16_t *pcVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  
  uVar3 = s1->len;
  iVar6 = 1;
  if (uVar3 == s2->len) {
    if (0 < (int)uVar3) {
      pcVar4 = (s1->string).ptr;
      pcVar5 = (s2->string).ptr;
      uVar8 = 0;
      do {
        cVar1 = pcVar4[uVar8];
        iVar6 = tolower((uint)(ushort)cVar1);
        cVar2 = pcVar5[uVar8];
        iVar7 = tolower((uint)(ushort)cVar2);
        if (iVar6 != iVar7) {
          return -(uint)((ushort)cVar1 < (ushort)cVar2) | 1;
        }
        uVar8 = uVar8 + 1;
      } while (uVar3 != uVar8);
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int NoCaseComparer<JsUtil::CharacterBuffer<WCHAR>>::Compare(JsUtil::CharacterBuffer<WCHAR> const& s1, JsUtil::CharacterBuffer<WCHAR> const& s2)
    {
        if (s1.GetLength() != s2.GetLength()) return +1;
        int count = s1.GetLength();
        const char16* buf1 = s1.GetBuffer();
        const char16* buf2 = s2.GetBuffer();
        for (int i=0; i < count; i++)
        {
            if (tolower(buf1[i]) != tolower(buf2[i]))
            {
                return (buf1[i] < buf2[i] ? -1 : +1);
            }
        }
        return (0);
    }